

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingEx.cpp
# Opt level: O3

int GetMapping<int>(int mapMe,vector<int,_std::allocator<int>_> *mappings)

{
  int iVar1;
  pointer piVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mapping range: ",0xf);
  piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar8 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar2[uVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar8 = uVar8 + 1;
      piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar5 = (long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  iVar7 = mapMe;
  if (lVar5 != 0) {
    uVar8 = 0;
    uVar6 = 0;
    do {
      iVar1 = piVar2[uVar8];
      if (mapMe <= iVar1) {
        iVar7 = iVar1;
      }
      uVar6 = (iVar1 < mapMe) + uVar6;
      uVar8 = (ulong)uVar6;
    } while ((uVar8 < (ulong)(lVar5 >> 2)) && (iVar1 < mapMe));
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mapMe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is mapped to ",0xe);
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return iVar7;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i = 0;
   bool keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}